

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapParser.cpp
# Opt level: O1

string * rc::detail::anon_unknown_0::pairToString
                   (string *__return_storage_ptr__,
                   pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *pair,bool doubleQuote)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong *local_80;
  long local_78;
  ulong local_70;
  long lStack_68;
  string local_60;
  string local_40;
  
  if ((pair->second)._M_string_length == 0) {
    maybeQuoteString(__return_storage_ptr__,&pair->first,doubleQuote);
    return __return_storage_ptr__;
  }
  maybeQuoteString(&local_40,&pair->first,doubleQuote);
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_40,local_40._M_string_length,0,'\x01');
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_70 = *puVar4;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *puVar4;
    local_80 = (ulong *)*plVar2;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  maybeQuoteString(&local_60,&pair->second,doubleQuote);
  uVar5 = 0xf;
  if (local_80 != &local_70) {
    uVar5 = local_70;
  }
  if (uVar5 < local_60._M_string_length + local_78) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar6 = local_60.field_2._M_allocated_capacity;
    }
    if (local_60._M_string_length + local_78 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
      goto LAB_0016e18e;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60._M_dataplus._M_p);
LAB_0016e18e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar6 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string pairToString(const std::pair<std::string, std::string> &pair,
                         bool doubleQuote) {
  if (pair.second.empty()) {
    return maybeQuoteString(pair.first, doubleQuote);
  } else {
    return maybeQuoteString(pair.first, doubleQuote) + '=' +
        maybeQuoteString(pair.second, doubleQuote);
  }
}